

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

xml_node __thiscall
pugi::xml_node::insert_copy_before(xml_node *this,xml_node *proto,xml_node *node)

{
  ulong uVar1;
  xml_allocator *this_00;
  size_t sVar2;
  xml_node_struct *pxVar3;
  xml_node_struct *pxVar4;
  xml_node_struct *pxVar5;
  xml_memory_page *in_RAX;
  xml_node_struct *pxVar6;
  xml_node_struct **ppxVar7;
  uint uVar8;
  uint uVar9;
  xml_memory_page *local_28;
  
  if (proto->_root == (xml_node_struct *)0x0) {
    uVar9 = 0;
  }
  else {
    uVar9 = (uint)proto->_root->header & 0xf;
  }
  pxVar6 = this->_root;
  if (pxVar6 != (xml_node_struct *)0x0) {
    if (uVar9 < 2) {
      return (xml_node)(xml_node_struct *)0x0;
    }
    uVar8 = (uint)pxVar6->header & 0xf;
    if (uVar8 - 3 < 0xfffffffe) {
      return (xml_node)(xml_node_struct *)0x0;
    }
    if (((uVar9 - 9 < 0xfffffffe || uVar8 == 1) && (node->_root != (xml_node_struct *)0x0)) &&
       (node->_root->parent == pxVar6)) {
      this_00 = *(xml_allocator **)((long)pxVar6 - (pxVar6->header >> 8));
      sVar2 = this_00->_busy_size;
      uVar1 = sVar2 + 0x40;
      if (uVar1 < 0x7fd9) {
        local_28 = this_00->_root;
        this_00->_busy_size = uVar1;
        pxVar6 = (xml_node_struct *)((long)&local_28[1].allocator + sVar2);
      }
      else {
        local_28 = in_RAX;
        pxVar6 = (xml_node_struct *)
                 impl::anon_unknown_0::xml_allocator::allocate_memory_oob(this_00,0x40,&local_28);
        if (pxVar6 == (xml_node_struct *)0x0) {
          return (xml_node)(xml_node_struct *)0x0;
        }
      }
      pxVar6->first_child = (xml_node_struct *)0x0;
      pxVar6->prev_sibling_c = (xml_node_struct *)0x0;
      pxVar6->next_sibling = (xml_node_struct *)0x0;
      pxVar6->first_attribute = (xml_attribute_struct *)0x0;
      pxVar6->name = (char_t *)0x0;
      pxVar6->value = (char_t *)0x0;
      pxVar6->parent = (xml_node_struct *)0x0;
      pxVar6->first_child = (xml_node_struct *)0x0;
      pxVar6->header = (ulong)uVar9 | ((long)pxVar6 - (long)local_28) * 0x100;
      pxVar3 = node->_root;
      pxVar4 = pxVar3->parent;
      pxVar6->parent = pxVar4;
      pxVar5 = pxVar3->prev_sibling_c;
      ppxVar7 = &pxVar4->first_child;
      if (pxVar5->next_sibling != (xml_node_struct *)0x0) {
        ppxVar7 = &pxVar5->next_sibling;
      }
      *ppxVar7 = pxVar6;
      pxVar6->prev_sibling_c = pxVar5;
      pxVar6->next_sibling = pxVar3;
      pxVar3->prev_sibling_c = pxVar6;
      impl::anon_unknown_0::node_copy_tree(pxVar6,proto->_root);
      return (xml_node)pxVar6;
    }
  }
  return (xml_node)(xml_node_struct *)0x0;
}

Assistant:

PUGI__FN xml_node xml_node::insert_copy_before(const xml_node& proto, const xml_node& node)
	{
		xml_node_type type_ = proto.type();
		if (!impl::allow_insert_child(type(), type_)) return xml_node();
		if (!node._root || node._root->parent != _root) return xml_node();

		impl::xml_allocator& alloc = impl::get_allocator(_root);
		if (!alloc.reserve()) return xml_node();

		xml_node n(impl::allocate_node(alloc, type_));
		if (!n) return xml_node();

		impl::insert_node_before(n._root, node._root);
		impl::node_copy_tree(n._root, proto._root);

		return n;
	}